

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

_Bool dump_content(GError **error)

{
  _Bool _Var1;
  char *in_RSI;
  code *local_30;
  _func_void_varargs *print_footer_func;
  _func_void_rbin_struct_ptr_metarecord_ptr *print_record_func;
  _func_void_metarecord_ptr *print_header_func;
  GError **error_local;
  
  if ((output_loc != (char *)0x0) && (_Var1 = get_tempfile(error), !_Var1)) {
    return false;
  }
  if (output_format == FORMAT_TEXT) {
    print_record_func = _print_text_header;
    if ((no_heading & 1U) != 0) {
      print_record_func = (_func_void_rbin_struct_ptr_metarecord_ptr *)0x0;
    }
    print_footer_func = _print_text_record;
    local_30 = (code *)0x0;
  }
  else if (output_format == FORMAT_XML) {
    print_record_func = _print_xml_header;
    print_footer_func = _print_xml_record;
    local_30 = _print_xml_footer;
  }
  else if (output_format == FORMAT_JSON) {
    print_record_func = _print_json_header;
    print_footer_func = _print_json_record;
    local_30 = _print_json_footer;
  }
  else {
    in_RSI = "/workspace/llm4binary/github/license_c_cmakelists/abelcheung[P]rifiuti2/src/utils.c";
    g_assertion_message_expr
              ("rifiuti2",
               "/workspace/llm4binary/github/license_c_cmakelists/abelcheung[P]rifiuti2/src/utils.c"
               ,0x50b,"dump_content",0);
  }
  if (print_record_func != (_func_void_rbin_struct_ptr_metarecord_ptr *)0x0) {
    (*print_record_func)((rbin_struct *)meta,(metarecord *)in_RSI);
  }
  g_ptr_array_foreach(meta->records,print_footer_func,meta);
  if (local_30 != (code *)0x0) {
    (*local_30)();
  }
  if (output_loc == (char *)0x0) {
    error_local._7_1_ = true;
  }
  else {
    error_local._7_1_ = clean_tempfile(output_loc,error);
  }
  return error_local._7_1_;
}

Assistant:

bool
dump_content (GError **error)
{
    void (*print_header_func)(const metarecord *);
    void (*print_record_func)(rbin_struct *, const metarecord *);
    void (*print_footer_func)();

    // TODO use g_file_set_contents_full in glib 2.66
    if (output_loc && ! get_tempfile (error))
            return false;

    switch (output_format)
    {
        case FORMAT_TEXT:
            print_header_func = no_heading ?
                NULL : &_print_text_header;
            print_record_func = &_print_text_record;
            print_footer_func = NULL;
            break;
        case FORMAT_XML:
            print_header_func = &_print_xml_header;
            print_record_func = &_print_xml_record;
            print_footer_func = &_print_xml_footer;
            break;
        case FORMAT_JSON:
            print_header_func = &_print_json_header;
            print_record_func = &_print_json_record;
            print_footer_func = &_print_json_footer;
            break;

        default: g_assert_not_reached();
    }

    if (print_header_func != NULL)
        (*print_header_func) (meta);
    g_ptr_array_foreach (meta->records, (GFunc) print_record_func, meta);
    if (print_footer_func != NULL)
        (*print_footer_func) ();

    if (output_loc)
        return clean_tempfile (output_loc, error);
    else
        return true;
}